

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecollection.cpp
# Opt level: O2

int CFileCollection::FilelistCallback(char *pFilename,int IsDir,int StorageType,void *pUser)

{
  bool bVar1;
  int64 Timestamp;
  CFileCollection *this;
  
  if ((IsDir == 0) &&
     (this = (CFileCollection *)pUser, bVar1 = IsFilenameValid((CFileCollection *)pUser,pFilename),
     bVar1)) {
    Timestamp = ExtractTimestamp(this,pFilename + (long)*(int *)((long)pUser + 0x1fc8) + 1);
    AddEntry((CFileCollection *)pUser,Timestamp);
  }
  return 0;
}

Assistant:

int CFileCollection::FilelistCallback(const char *pFilename, int IsDir, int StorageType, void *pUser)
{
	CFileCollection *pThis = static_cast<CFileCollection *>(pUser);

	// check for valid file name format
	if(IsDir || !pThis->IsFilenameValid(pFilename))
		return 0;

	// extract the timestamp
	int64 Timestamp = pThis->ExtractTimestamp(pFilename+pThis->m_FileDescLength+1);

	// add the entry
	pThis->AddEntry(Timestamp);

	return 0;
}